

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::Option::_reduce_results(Option *this,results_t *out,results_t *original)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  type_conflict2 tVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ArgumentMismatch *pAVar8;
  uint uVar9;
  string *delim;
  pointer pbVar10;
  ulong uVar11;
  int num;
  pointer pbVar12;
  undefined8 uVar13;
  int iVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  int t;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80;
  undefined1 uStack_7f;
  undefined6 uStack_7e;
  string local_70;
  string local_50;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(out,(out->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  switch((this->super_OptionBase<CLI::Option>).multi_option_policy_) {
  case TakeLast:
    local_b0._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar4 = detail::checked_multiply<int>((int *)&local_b0,this->expected_max_);
    uVar11 = 1;
    if (1 < (int)(uint)local_b0._M_dataplus._M_p) {
      uVar11 = (ulong)(uint)local_b0._M_dataplus._M_p;
    }
    uVar5 = 0x20000000;
    if (tVar4) {
      uVar5 = uVar11;
    }
    pbVar10 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar10 -
                (long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5) break;
    pbVar12 = pbVar10 + -uVar5;
    goto LAB_00241677;
  case TakeFirst:
    local_b0._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar4 = detail::checked_multiply<int>((int *)&local_b0,this->expected_max_);
    uVar11 = 1;
    if (1 < (int)(uint)local_b0._M_dataplus._M_p) {
      uVar11 = (ulong)(uint)local_b0._M_dataplus._M_p;
    }
    uVar5 = 0x20000000;
    if (tVar4) {
      uVar5 = uVar11;
    }
    pbVar12 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) <= uVar5)
    break;
    pbVar10 = pbVar12 + uVar5;
LAB_00241677:
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,pbVar12,
               pbVar10);
    break;
  case Join:
    if ((ulong)((long)(this->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) break;
    bVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
    delim = (string *)0xa;
    if (bVar1 != 0) {
      delim = (string *)(ulong)bVar1;
    }
    local_80 = SUB81(delim,0);
    local_90._8_8_ = 1;
    uStack_7f = 0;
    local_90._M_allocated_capacity = (size_type)&local_80;
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_b0,(detail *)original,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_90,delim);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint)local_b0._M_dataplus._M_p) !=
        &local_b0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint)local_b0._M_dataplus._M_p),
                      local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_90._M_allocated_capacity == &local_80) break;
    local_b0.field_2._M_allocated_capacity = CONCAT62(uStack_7e,CONCAT11(uStack_7f,local_80));
    uVar13 = local_90._M_allocated_capacity;
    goto LAB_00241714;
  case TakeAll:
    break;
  case Sum:
    detail::sum_string_vector(&local_b0,original);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
    uVar13 = CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar13 == &local_b0.field_2) break;
LAB_00241714:
    operator_delete((void *)uVar13,local_b0.field_2._M_allocated_capacity + 1);
    break;
  case Reverse:
    local_b0._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar4 = detail::checked_multiply<int>((int *)&local_b0,this->expected_max_);
    uVar11 = 1;
    if (1 < (int)(uint)local_b0._M_dataplus._M_p) {
      uVar11 = (ulong)(uint)local_b0._M_dataplus._M_p;
    }
    uVar5 = 0x20000000;
    if (tVar4) {
      uVar5 = uVar11;
    }
    pbVar12 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)pbVar12 -
            (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    uVar11 = uVar6;
    if (uVar5 <= uVar6) {
      uVar11 = uVar5;
    }
    if ((uVar5 < uVar6) || (1 < uVar11)) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
                 pbVar12 + -uVar11);
    }
    pbVar12 = (out->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar10 = (out->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pbVar10 + -1);
    if (pbVar12 < __s && pbVar12 != pbVar10) {
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar12,__s)
        ;
        pbVar12 = (pointer)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pbVar12 + 1);
        __s = __s + -1;
      } while (pbVar12 < __s);
    }
    break;
  default:
    iVar14 = this->expected_min_ * this->type_size_min_;
    local_b0._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar4 = detail::checked_multiply<int>((int *)&local_b0,this->expected_max_);
    uVar9 = 0x20000000;
    if (tVar4) {
      uVar9 = (uint)local_b0._M_dataplus._M_p;
    }
    iVar14 = iVar14 + (uint)(iVar14 == 0);
    num = uVar9 + (uVar9 == 0);
    pbVar12 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12;
    uVar11 = lVar7 >> 5;
    if (uVar11 < (ulong)(long)iVar14) {
      pAVar8 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_50,this,false,false);
      CLI::ArgumentMismatch::AtLeast
                (pAVar8,&local_50,iVar14,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar8,&CLI::ArgumentMismatch::typeinfo,Error::~Error);
    }
    if ((ulong)(long)num < uVar11) {
      if ((((1 < uVar9) || (lVar7 != 0x40)) ||
          (iVar14 = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (pbVar12 + 1,"%%"), iVar14 != 0)) ||
         (iVar14 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::compare((original->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,"{}"), iVar14 != 0)) {
        pAVar8 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        get_name_abi_cxx11_(&local_70,this,false,false);
        CLI::ArgumentMismatch::AtMost
                  (pAVar8,&local_70,num,
                   (long)(original->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(original->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(pAVar8,&CLI::ArgumentMismatch::typeinfo,Error::~Error);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)out,original);
    }
  }
  pbVar2 = (out->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (out->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    pbVar2 = (original->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 != 0x20) {
      return;
    }
    iVar14 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare(pbVar2,"{}");
    if (iVar14 != 0) {
      return;
    }
    if (this->expected_min_ * this->type_size_min_ < 1) {
      return;
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
               (char (*) [3])0x43e30e);
  }
  else {
    if ((long)pbVar3 - (long)pbVar2 != 0x20) {
      return;
    }
    iVar14 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare(pbVar2,"{}");
    if (iVar14 != 0) {
      return;
    }
    if (this->expected_min_ * this->type_size_min_ < 1) {
      return;
    }
  }
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
             (char (*) [3])"%%");
  return;
}

Assistant:

CLI11_INLINE void Option::_reduce_results(results_t &out, const results_t &original) const {

    // max num items expected or length of vector, always at least 1
    // Only valid for a trimming policy

    out.clear();
    // Operation depends on the policy setting
    switch(multi_option_policy_) {
    case MultiOptionPolicy::TakeAll:
        break;
    case MultiOptionPolicy::TakeLast: {
        // Allow multi-option sizes (including 0)
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size) {
            out.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
        }
    } break;
    case MultiOptionPolicy::Reverse: {
        // Allow multi-option sizes (including 0)
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size || trim_size > 1) {
            out.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
        }
        std::reverse(out.begin(), out.end());
    } break;
    case MultiOptionPolicy::TakeFirst: {
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size) {
            out.assign(original.begin(), original.begin() + static_cast<results_t::difference_type>(trim_size));
        }
    } break;
    case MultiOptionPolicy::Join:
        if(results_.size() > 1) {
            out.push_back(detail::join(original, std::string(1, (delimiter_ == '\0') ? '\n' : delimiter_)));
        }
        break;
    case MultiOptionPolicy::Sum:
        out.push_back(detail::sum_string_vector(original));
        break;
    case MultiOptionPolicy::Throw:
    default: {
        auto num_min = static_cast<std::size_t>(get_items_expected_min());
        auto num_max = static_cast<std::size_t>(get_items_expected_max());
        if(num_min == 0) {
            num_min = 1;
        }
        if(num_max == 0) {
            num_max = 1;
        }
        if(original.size() < num_min) {
            throw ArgumentMismatch::AtLeast(get_name(), static_cast<int>(num_min), original.size());
        }
        if(original.size() > num_max) {
            if(original.size() == 2 && num_max == 1 && original[1] == "%%" && original[0] == "{}") {
                // this condition is a trap for the following empty indicator check on config files
                out = original;
            } else {
                throw ArgumentMismatch::AtMost(get_name(), static_cast<int>(num_max), original.size());
            }
        }
        break;
    }
    }
    // this check is to allow an empty vector in certain circumstances but not if expected is not zero.
    // {} is the indicator for an empty container
    if(out.empty()) {
        if(original.size() == 1 && original[0] == "{}" && get_items_expected_min() > 0) {
            out.emplace_back("{}");
            out.emplace_back("%%");
        }
    } else if(out.size() == 1 && out[0] == "{}" && get_items_expected_min() > 0) {
        out.emplace_back("%%");
    }
}